

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::OneofDescriptorProto::InternalSerializeWithCachedSizesToArray
          (OneofDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint32 uVar1;
  uint8 *target_00;
  Container *target_01;
  EpsCopyOutputStream *in_RDX;
  EpsCopyOutputStream *in_RSI;
  OneofDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  Operation in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  EpsCopyOutputStream *in_stack_ffffffffffffff40;
  EpsCopyOutputStream *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar2;
  EpsCopyOutputStream *pEVar3;
  InternalMetadataWithArena *pIVar4;
  
  uVar2 = (in_RDI->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    _internal_name_abi_cxx11_((OneofDescriptorProto *)0x4fcde0);
    std::__cxx11::string::data();
    _internal_name_abi_cxx11_((OneofDescriptorProto *)0x4fcdf7);
    std::__cxx11::string::length();
    in_stack_ffffffffffffff50 = in_RDX;
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38
               ,(char *)0x4fce17);
    pEVar3 = in_stack_ffffffffffffff50;
    _internal_name_abi_cxx11_((OneofDescriptorProto *)0x4fce2b);
    in_RSI = (EpsCopyOutputStream *)
             io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (in_RSI,(uint32)((ulong)pEVar3 >> 0x20),
                        (string *)CONCAT44(uVar2,in_stack_ffffffffffffff60),(uint8 *)in_RDI);
  }
  if ((uVar2 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_ffffffffffffff40,
               (uint8 **)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    _Internal::options(in_RDI);
    uVar1 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar1,(uint8 *)in_RSI);
    uVar1 = OneofOptions::GetCachedSize((OneofOptions *)0x4fcf1b);
    io::CodedOutputStream::WriteVarint32ToArray(uVar1,target_00);
    in_RSI = (EpsCopyOutputStream *)
             OneofOptions::InternalSerializeWithCachedSizesToArray
                       ((OneofOptions *)CONCAT44(uVar2,in_stack_ffffffffffffff60),(uint8 *)in_RDI,
                        in_stack_ffffffffffffff50);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    pEVar3 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    pIVar4 = (InternalMetadataWithArena *)pEVar3;
    if (((uint)(((InternalMetadataWithArena *)pEVar3)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      target_01 = internal::
                  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  ::
                  PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                            ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                              *)pEVar3);
    }
    else {
      target_01 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    in_RSI = (EpsCopyOutputStream *)
             internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)pIVar4,(uint8 *)target_01,pEVar3);
  }
  return (uint8 *)in_RSI;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* OneofDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.OneofDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.OneofDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional .google.protobuf.OneofOptions options = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        2, _Internal::options(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.OneofDescriptorProto)
  return target;
}